

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

void __thiscall
BasicTestingSetup::BasicTestingSetup(BasicTestingSetup *this,ChainType chainType,TestOpts *opts)

{
  string_view str_err;
  string_view str_err_00;
  string_view str_err_01;
  initializer_list<const_char_*> __l;
  bool bVar1;
  byte bVar2;
  LockResult LVar3;
  runtime_error *this_00;
  basic_ostream<char,_std::char_traits<char>_> *this_01;
  ArgsManager *this_02;
  Logger *this_03;
  long in_RDI;
  long in_FS_OFFSET;
  vector<const_char_*,_std::allocator<const_char_*>_> arguments;
  string test_path;
  path root_dir;
  string rand_str;
  string error;
  ArgsManager *in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8d0;
  ChainType in_stack_fffffffffffff8d4;
  undefined7 in_stack_fffffffffffff8d8;
  undefined7 uVar4;
  char in_stack_fffffffffffff8df;
  undefined1 uVar5;
  undefined4 in_stack_fffffffffffff8e0;
  SeedRand in_stack_fffffffffffff8e4;
  BasicTestingSetup *in_stack_fffffffffffff8e8;
  ArgsManager *in_stack_fffffffffffff8f0;
  ArgsManager *in_stack_fffffffffffff8f8;
  path *in_stack_fffffffffffff900;
  path *in_stack_fffffffffffff908;
  string *strArg;
  path *in_stack_fffffffffffff910;
  ArgsManager *in_stack_fffffffffffff918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_04;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffff920;
  path *lockfile_name;
  path *directory;
  undefined6 in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff986;
  undefined1 in_stack_fffffffffffff987;
  char **in_stack_fffffffffffff988;
  undefined8 in_stack_fffffffffffff990;
  int argc;
  ArgsManager *in_stack_fffffffffffff998;
  unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> local_588 [7];
  undefined1 local_54a;
  undefined1 local_549 [46];
  allocator<char> local_51b;
  allocator<char> local_51a;
  allocator<char> local_519 [465];
  path local_348 [4];
  path local_2a8 [2];
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  string local_98 [64];
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  char *local_28;
  char *pcStack_20;
  char *local_18;
  long local_8;
  
  argc = (int)((ulong)in_stack_fffffffffffff990 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  util::SignalInterrupt::SignalInterrupt((SignalInterrupt *)in_stack_fffffffffffff910);
  ::node::NodeContext::NodeContext
            ((NodeContext *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
             SUB41(in_stack_fffffffffffff8d4 >> 0x18,0));
  fs::path::path((path *)in_stack_fffffffffffff8c8);
  fs::path::path((path *)in_stack_fffffffffffff8c8);
  *(undefined1 *)(in_RDI + 0x1e8) = 0;
  ArgsManager::ArgsManager(in_stack_fffffffffffff8c8);
  *(long *)(in_RDI + 0x28) = in_RDI;
  *(ArgsManager **)(in_RDI + 0x70) = &gArgs;
  local_18 = "-debugexclude=leveldb";
  local_28 = "-debug";
  pcStack_20 = "-debugexclude=libevent";
  local_38 = "-logthreadnames";
  pcStack_30 = "-loglevel=trace";
  local_48 = "-logsourcelocations";
  pcStack_40 = "-logtimemicros";
  local_58 = "dummy";
  pcStack_50 = "-printtoconsole=0";
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_fffffffffffff8c8);
  __l._M_len = (size_type)in_stack_fffffffffffff918;
  __l._M_array = (iterator)in_stack_fffffffffffff910;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffff908,__l,
             (allocator_type *)in_stack_fffffffffffff900);
  Cat<std::vector<char_const*,std::allocator<char_const*>>>
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffff900,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffff8f8);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_fffffffffffff8c8);
  bVar1 = std::function::operator_cast_to_bool
                    ((function<std::vector<const_char_*,_std::allocator<const_char_*>_>_()> *)
                     in_stack_fffffffffffff8c8);
  if (bVar1) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (in_stack_fffffffffffff920,
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffff918);
    std::function<std::vector<const_char_*,_std::allocator<const_char_*>_>_()>::operator()
              ((function<std::vector<const_char_*,_std::allocator<const_char_*>_>_()> *)
               CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
    Cat<std::vector<char_const*,std::allocator<char_const*>>>
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffff900,
               (vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffff8f8);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator=
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)
               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,
             (allocator<char> *)in_stack_fffffffffffff908);
  util::ThreadRename((string *)in_stack_fffffffffffff8e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff8c8);
  std::allocator<char>::~allocator(local_519);
  ArgsManager::ClearPathCache(in_stack_fffffffffffff8f8);
  SetupServerArgs(*(ArgsManager **)(in_RDI + 0x70),false);
  SetupUnitTestArgs(in_stack_fffffffffffff8f0);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::size
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffff8c8);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::data
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffff8c8);
  bVar1 = ArgsManager::ParseParameters
                    (in_stack_fffffffffffff998,argc,in_stack_fffffffffffff988,
                     (string *)
                     CONCAT17(in_stack_fffffffffffff987,
                              CONCAT16(in_stack_fffffffffffff986,in_stack_fffffffffffff980)));
  if (bVar1) {
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8c8);
    SeedRandomForTest(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,
               (allocator<char> *)in_stack_fffffffffffff908);
    bVar1 = ArgsManager::IsArgSet(in_stack_fffffffffffff8f0,(string *)in_stack_fffffffffffff8e8);
    bVar2 = bVar1 ^ 0xff;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8c8);
    std::allocator<char>::~allocator(&local_51a);
    if ((bVar2 & 1) == 0) {
      *(undefined1 *)(in_RDI + 0x1e8) = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,
                 (allocator<char> *)in_stack_fffffffffffff908);
      local_228 = 0;
      uStack_220 = 0;
      local_238 = 0;
      uStack_230 = 0;
      local_218 = 0;
      fs::path::path((path *)in_stack_fffffffffffff8c8);
      ArgsManager::GetPathArg
                (in_stack_fffffffffffff918,&in_stack_fffffffffffff910->_M_pathname,
                 (path *)in_stack_fffffffffffff908);
      fs::path::~path((path *)in_stack_fffffffffffff8c8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8c8);
      std::allocator<char>::~allocator(&local_51b);
      bVar1 = std::filesystem::__cxx11::path::empty((path *)in_stack_fffffffffffff8c8);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8e8,
                   (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
        str_err._M_len._7_1_ = in_stack_fffffffffffff8df;
        str_err._M_len._0_7_ = in_stack_fffffffffffff8d8;
        str_err._M_str._0_4_ = in_stack_fffffffffffff8e0;
        str_err._M_str._4_4_ = in_stack_fffffffffffff8e4;
        ExitFailure(str_err);
      }
      fs::absolute((path *)in_stack_fffffffffffff8f8);
      fs::path::operator=((path *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                          (path *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      fs::path::~path((path *)in_stack_fffffffffffff8c8);
      bVar1 = std::function::operator_cast_to_bool
                        ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                          *)in_stack_fffffffffffff8c8);
      if (bVar1) {
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
        ::operator()((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                      *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff918,(char *)in_stack_fffffffffffff910,
                   (allocator<char> *)in_stack_fffffffffffff908);
        std::allocator<char>::~allocator((allocator<char> *)(local_549 + 0x18));
      }
      fs::path::path((path *)in_stack_fffffffffffff8c8,(path *)0xea5c00);
      fs::operator/((path *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                    (char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
      fs::PathFromString((string *)in_stack_fffffffffffff8f8);
      fs::operator/((path *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                    (path *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
      directory = local_2a8;
      fs::path::operator=((path *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                          (path *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      fs::path::~path((path *)in_stack_fffffffffffff8c8);
      fs::path::~path((path *)in_stack_fffffffffffff8c8);
      fs::path::~path((path *)in_stack_fffffffffffff8c8);
      fs::path::~path((path *)in_stack_fffffffffffff8c8);
      fs::path::path((path *)in_stack_fffffffffffff8c8,(path *)0xea5ccb);
      fs::operator/((path *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                    (char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
      lockfile_name = local_348;
      fs::path::operator=((path *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                          (path *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      fs::path::~path((path *)in_stack_fffffffffffff8c8);
      fs::path::~path((path *)in_stack_fffffffffffff8c8);
      TryCreateDirectories((path *)in_stack_fffffffffffff8f0);
      uVar5 = (undefined1)((ulong)(in_RDI + 0x1c0) >> 0x38);
      fs::path::path((path *)0xea5d60,(char *)in_stack_fffffffffffff8c8);
      LVar3 = util::LockDirectory(directory,lockfile_name,(bool)uVar5);
      fs::path::~path((path *)in_stack_fffffffffffff8c8);
      if (LVar3 != Success) {
        fs::PathToString_abi_cxx11_
                  ((path *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        std::operator+((char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                       in_stack_fffffffffffff8df);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
                       (char *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8e8);
        str_err_00._M_len._7_1_ = in_stack_fffffffffffff8df;
        str_err_00._M_len._0_7_ = in_stack_fffffffffffff8d8;
        str_err_00._M_str._0_4_ = in_stack_fffffffffffff8e0;
        str_err_00._M_str._4_4_ = in_stack_fffffffffffff8e4;
        ExitFailure(str_err_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8c8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8c8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8c8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8c8);
      }
      std::filesystem::remove_all((path *)(in_RDI + 0x198));
      bVar1 = TryCreateDirectories((path *)in_stack_fffffffffffff8f0);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8e8,
                   (char *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
        str_err_01._M_len._7_1_ = in_stack_fffffffffffff8df;
        str_err_01._M_len._0_7_ = in_stack_fffffffffffff8d8;
        str_err_01._M_str._0_4_ = in_stack_fffffffffffff8e0;
        str_err_01._M_str._4_4_ = in_stack_fffffffffffff8e4;
        ExitFailure(str_err_01);
      }
      std::operator<<((ostream *)&std::cout,"Test directory (will not be deleted): ");
      this_01 = std::filesystem::__cxx11::operator<<
                          ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff910
                           ,in_stack_fffffffffffff908);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8c8);
      fs::path::~path((path *)in_stack_fffffffffffff8c8);
    }
    else {
      RandomMixin<FastRandomContext>::rand256
                ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffff8f8);
      base_blob<256u>::ToString_abi_cxx11_
                ((base_blob<256U> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      std::filesystem::temp_directory_path_abi_cxx11_();
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                (in_stack_fffffffffffff910,(char **)in_stack_fffffffffffff908,
                 (format)((ulong)in_stack_fffffffffffff900 >> 0x38));
      std::filesystem::__cxx11::operator/
                (in_stack_fffffffffffff900,(path *)in_stack_fffffffffffff8f8);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (in_stack_fffffffffffff910,&in_stack_fffffffffffff908->_M_pathname,
                 (format)((ulong)in_stack_fffffffffffff900 >> 0x38));
      std::filesystem::__cxx11::operator/
                (in_stack_fffffffffffff900,(path *)in_stack_fffffffffffff8f8);
      fs::path::operator=((path *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
                          (path *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff8c8);
      std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff8c8);
      std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff8c8);
      std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff8c8);
      std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff8c8);
      TryCreateDirectories((path *)in_stack_fffffffffffff8f0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8c8);
    }
    this_02 = (ArgsManager *)(in_RDI + 0x1f0);
    this_04 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_549;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_04,(char *)this_02,(allocator<char> *)in_stack_fffffffffffff908);
    fs::PathToString_abi_cxx11_
              ((path *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    ArgsManager::ForceSetArg
              (this_02,&in_stack_fffffffffffff908->_M_pathname,
               &in_stack_fffffffffffff900->_M_pathname);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8c8);
    std::allocator<char>::~allocator((allocator<char> *)local_549);
    strArg = (string *)&local_54a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_04,(char *)this_02,(allocator<char> *)strArg);
    fs::PathToString_abi_cxx11_
              ((path *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    ArgsManager::ForceSetArg(this_02,strArg,&in_stack_fffffffffffff900->_M_pathname);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_54a);
    SelectParams(in_stack_fffffffffffff8d4);
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)in_stack_fffffffffffff8c8);
    if (bVar1) {
      this_03 = LogInstance();
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)in_stack_fffffffffffff8e8,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0));
      BCLog::Logger::PushBackCallback
                (this_03,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)in_stack_fffffffffffff8f8);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)in_stack_fffffffffffff8c8);
    }
    InitLogging(in_stack_fffffffffffff8c8);
    AppInitParameterInteraction(*(ArgsManager **)(in_RDI + 0x70));
    LogInstance();
    BCLog::Logger::StartLogging((Logger *)in_stack_fffffffffffff998);
    std::make_unique<node::Warnings>();
    std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::operator=
              ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
               CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::~unique_ptr
              ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    std::make_unique<kernel::Context>();
    std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::operator=
              ((unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8),
               (unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
               CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::~unique_ptr
              ((unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
               CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    std::make_unique<ECC_Context>();
    uVar4 = SUB87(local_588,0);
    uVar5 = (undefined1)((ulong)local_588 >> 0x38);
    std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::operator=
              (local_588,
               (unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)
               CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::~unique_ptr
              ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)CONCAT17(uVar5,uVar4));
    SetupEnvironment();
    interfaces::MakeChain((NodeContext *)CONCAT17(uVar5,uVar4));
    std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator=
              ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
               CONCAT17(uVar5,uVar4),
               (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
               CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::~unique_ptr
              ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
               CONCAT17(uVar5,uVar4));
    if ((BasicTestingSetup::noui_connected & 1U) == 0) {
      noui_connect();
      BasicTestingSetup::noui_connected = true;
    }
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)CONCAT17(uVar5,uVar4));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  else {
    ArgsManager::ClearArgs
              ((ArgsManager *)CONCAT17(in_stack_fffffffffffff8df,in_stack_fffffffffffff8d8));
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_98);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

BasicTestingSetup::BasicTestingSetup(const ChainType chainType, TestOpts opts)
    : m_args{}
{
    m_node.shutdown = &m_interrupt;
    m_node.args = &gArgs;
    std::vector<const char*> arguments = Cat(
        {
            "dummy",
            "-printtoconsole=0",
            "-logsourcelocations",
            "-logtimemicros",
            "-logthreadnames",
            "-loglevel=trace",
            "-debug",
            "-debugexclude=libevent",
            "-debugexclude=leveldb",
        },
        opts.extra_args);
    if (G_TEST_COMMAND_LINE_ARGUMENTS) {
        arguments = Cat(arguments, G_TEST_COMMAND_LINE_ARGUMENTS());
    }
    util::ThreadRename("test");
    gArgs.ClearPathCache();
    {
        SetupServerArgs(*m_node.args);
        SetupUnitTestArgs(*m_node.args);
        std::string error;
        if (!m_node.args->ParseParameters(arguments.size(), arguments.data(), error)) {
            m_node.args->ClearArgs();
            throw std::runtime_error{error};
        }
    }

    // Use randomly chosen seed for deterministic PRNG, so that (by default) test
    // data directories use a random name that doesn't overlap with other tests.
    SeedRandomForTest(SeedRand::FIXED_SEED);

    if (!m_node.args->IsArgSet("-testdatadir")) {
        // By default, the data directory has a random name
        const auto rand_str{g_rng_temp_path.rand256().ToString()};
        m_path_root = fs::temp_directory_path() / TEST_DIR_PATH_ELEMENT / rand_str;
        TryCreateDirectories(m_path_root);
    } else {
        // Custom data directory
        m_has_custom_datadir = true;
        fs::path root_dir{m_node.args->GetPathArg("-testdatadir")};
        if (root_dir.empty()) ExitFailure("-testdatadir argument is empty, please specify a path");

        root_dir = fs::absolute(root_dir);
        const std::string test_path{G_TEST_GET_FULL_NAME ? G_TEST_GET_FULL_NAME() : ""};
        m_path_lock = root_dir / TEST_DIR_PATH_ELEMENT / fs::PathFromString(test_path);
        m_path_root = m_path_lock / "datadir";

        // Try to obtain the lock; if unsuccessful don't disturb the existing test.
        TryCreateDirectories(m_path_lock);
        if (util::LockDirectory(m_path_lock, ".lock", /*probe_only=*/false) != util::LockResult::Success) {
            ExitFailure("Cannot obtain a lock on test data lock directory " + fs::PathToString(m_path_lock) + '\n' + "The test executable is probably already running.");
        }

        // Always start with a fresh data directory; this doesn't delete the .lock file located one level above.
        fs::remove_all(m_path_root);
        if (!TryCreateDirectories(m_path_root)) ExitFailure("Cannot create test data directory");

        // Print the test directory name if custom.
        std::cout << "Test directory (will not be deleted): " << m_path_root << std::endl;
    }
    m_args.ForceSetArg("-datadir", fs::PathToString(m_path_root));
    gArgs.ForceSetArg("-datadir", fs::PathToString(m_path_root));

    SelectParams(chainType);
    if (G_TEST_LOG_FUN) LogInstance().PushBackCallback(G_TEST_LOG_FUN);
    InitLogging(*m_node.args);
    AppInitParameterInteraction(*m_node.args);
    LogInstance().StartLogging();
    m_node.warnings = std::make_unique<node::Warnings>();
    m_node.kernel = std::make_unique<kernel::Context>();
    m_node.ecc_context = std::make_unique<ECC_Context>();
    SetupEnvironment();

    m_node.chain = interfaces::MakeChain(m_node);
    static bool noui_connected = false;
    if (!noui_connected) {
        noui_connect();
        noui_connected = true;
    }
}